

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::session_settings_single_thread::set_str
          (session_settings_single_thread *this,int name,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *local_28;
  size_type local_20;
  size_type local_18;
  undefined8 uStack_10;
  
  local_28 = (size_type *)(value->_M_dataplus)._M_p;
  paVar1 = &value->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28 == paVar1) {
    local_18 = paVar1->_M_allocated_capacity;
    uStack_10 = *(undefined8 *)((long)&value->field_2 + 8);
    local_28 = &local_18;
  }
  else {
    local_18 = paVar1->_M_allocated_capacity;
  }
  local_20 = value->_M_string_length;
  (value->_M_dataplus)._M_p = (pointer)paVar1;
  value->_M_string_length = 0;
  (value->field_2)._M_local_buf[0] = '\0';
  if ((name & 0xc000U) == 0) {
    ::std::__cxx11::string::operator=
              ((string *)
               ((long)&(this->m_strings)._M_elems[0]._M_dataplus._M_p +
               (ulong)((name & 0x3fffU) << 5)),(string *)&local_28);
  }
  if (local_28 != &local_18) {
    operator_delete(local_28,local_18 + 1);
  }
  return;
}

Assistant:

void set_str(int name, std::string value)
		{ set<std::string>(m_strings, name, std::move(value), settings_pack::string_type_base); }